

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Mat * rotate(Mat *__return_storage_ptr__,Mat *src,int angle)

{
  Point_<float> *this;
  int iVar1;
  double *pdVar2;
  Scalar_<double> local_158;
  Rect_<float> local_138 [8];
  Size_ local_130 [8];
  _InputArray local_128;
  _OutputArray local_110;
  _InputArray local_f8;
  undefined1 local_dd;
  MatSize local_dc;
  Size2f local_d4 [3];
  Point_<float> local_bc;
  RotatedRect local_b4;
  Rect2f bbox;
  float local_94;
  Point_<float> local_90;
  undefined1 local_88 [8];
  Mat rot;
  Point2f center;
  int angle_local;
  Mat *src_local;
  Mat *final_img;
  
  this = (Point_<float> *)((long)rot.step.buf + 0xc);
  cv::Point_<float>::Point_(this,(float)(src->cols + -1) * 0.5,(float)(src->rows + -1) * 0.5);
  cv::Point_<float>::Point_(&local_90,this);
  cv::getRotationMatrix2D((Mat *)local_88,&local_90,(double)angle,1.0);
  cv::Point_<float>::Point_(&local_bc);
  cv::MatSize::operator()(&local_dc);
  cv::Size_::operator_cast_to_Size_((Size_ *)local_d4);
  cv::RotatedRect::RotatedRect(&local_b4,&local_bc,local_d4,(float)angle);
  cv::RotatedRect::boundingRect2f();
  iVar1 = src->cols;
  pdVar2 = cv::Mat::at<double>((Mat *)local_88,0,2);
  *pdVar2 = *pdVar2 + (double)_bbox * 0.5 + (double)iVar1 * -0.5;
  iVar1 = src->rows;
  pdVar2 = cv::Mat::at<double>((Mat *)local_88,1,2);
  *pdVar2 = *pdVar2 + (double)local_94 * 0.5 + (double)iVar1 * -0.5;
  local_dd = 0;
  cv::Mat::Mat(__return_storage_ptr__);
  cv::_InputArray::_InputArray(&local_f8,src);
  cv::_OutputArray::_OutputArray(&local_110,__return_storage_ptr__);
  cv::_InputArray::_InputArray(&local_128,(Mat *)local_88);
  cv::Rect_<float>::size(local_138);
  cv::Size_::operator_cast_to_Size_(local_130);
  cv::Scalar_<double>::Scalar_(&local_158);
  cv::warpAffine(&local_f8,&local_110,&local_128,local_130,1,0,&local_158);
  cv::_InputArray::~_InputArray(&local_128);
  cv::_OutputArray::~_OutputArray(&local_110);
  cv::_InputArray::~_InputArray(&local_f8);
  local_dd = 1;
  cv::Mat::~Mat((Mat *)local_88);
  return __return_storage_ptr__;
}

Assistant:

Mat rotate(Mat src,int angle){
    Point2f center((src.cols-1)/2.0, (src.rows-1)/2.0);
    Mat rot = getRotationMatrix2D(center, angle, 1.0);
    Rect2f bbox = RotatedRect(cv::Point2f(), src.size(), angle).boundingRect2f();
    rot.at<double>(0,2) += bbox.width/2.0 - src.cols/2.0;
    rot.at<double>(1,2) += bbox.height/2.0 - src.rows/2.0;
    Mat final_img;
    warpAffine(src, final_img, rot, bbox.size());
    return final_img;
}